

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if.h
# Opt level: O0

char * If_CutDsdPerm(If_Man_t *p,If_Cut_t *pCut)

{
  Vec_Str_t *p_00;
  int iVar1;
  int iVar2;
  char *pcVar3;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  p_00 = p->vTtPerms[*(uint *)&pCut->field_0x1c >> 0x18];
  iVar1 = Abc_Lit2Var(pCut->iCutFunc);
  iVar2 = Abc_MaxInt(6,*(uint *)&pCut->field_0x1c >> 0x18);
  pcVar3 = Vec_StrEntryP(p_00,iVar1 * iVar2);
  return pcVar3;
}

Assistant:

static inline char *     If_CutDsdPerm( If_Man_t * p, If_Cut_t * pCut )      { return Vec_StrEntryP( p->vTtPerms[pCut->nLeaves], Abc_Lit2Var(pCut->iCutFunc) * Abc_MaxInt(6, pCut->nLeaves) );           }